

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O3

void anon_unknown.dwarf_8b46::do_encode_decode_test<long>(long ekey)

{
  key_encoder *pkVar1;
  ulong uVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  key_encoder *local_58;
  ulong local_50;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  long local_40;
  long ekey_local;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  long akey;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  AssertHelper local_18;
  
  auVar4 = ZEXT816(0) << 0x40;
  local_58 = (key_encoder *)local_158;
  local_98 = ZEXT1632(auVar4);
  local_118 = ZEXT1632(auVar4);
  local_158 = ZEXT1632(auVar4);
  local_50 = 0x100;
  local_48 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_138 = local_158;
  local_f8 = local_118;
  local_d8 = local_118;
  local_b8 = local_118;
  local_78 = local_98;
  local_40 = ekey;
  unodb::key_encoder::ensure_available(local_58,8);
  pkVar1 = local_58;
  uVar2 = ekey ^ 0x8000000000000000;
  *(ulong *)(local_58->ibuf + (long)local_48) =
       uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
       (uVar2 & 0xff00) << 0x28 | ekey << 0x38;
  local_48 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)local_48 + 8);
  local_18.data_ = (AssertHelperData *)&DAT_00000008;
  local_30._M_head_impl = local_48;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&akey,"(kv.size_bytes())","(sizeof(ekey))",(unsigned_long *)&local_30,
             (unsigned_long *)&local_18);
  if ((char)akey == '\0') {
    testing::Message::Message((Message *)&local_30);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
               ,0x92,pcVar3);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  uVar2 = *(ulong *)pkVar1->ibuf ^ 0x80;
  local_30._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (*(ulong *)pkVar1->ibuf >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
        (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
        (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&akey,"(akey)","(ekey)",(long *)&local_30,&local_40);
  if ((char)akey == '\0') {
    testing::Message::Message((Message *)&local_18);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ekey_local,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
               ,0x97,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ekey_local,(Message *)&local_18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ekey_local);
    if (local_18.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_18.data_ + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  if (0x100 < local_50) {
    free(local_58);
  }
  return;
}

Assistant:

void do_encode_decode_test(const T ekey) {
  unodb::key_encoder enc{};
  enc.encode(ekey);
  const unodb::key_view kv = enc.get_key_view();   // encode
  UNODB_EXPECT_EQ(kv.size_bytes(), sizeof(ekey));  // check size
  // decode check
  unodb::key_decoder dec{kv};
  T akey;
  dec.decode(akey);
  UNODB_EXPECT_EQ(akey, ekey);
}